

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O2

int luaopen_io(lua_State *L)

{
  luaL_checkversion_(L,505.0,0x88);
  lua_createtable(L,0,0xb);
  luaL_setfuncs(L,iolib,0);
  luaL_newmetatable(L,"FILE*");
  luaL_setfuncs(L,metameth,0);
  lua_createtable(L,0,7);
  luaL_setfuncs(L,meth,0);
  lua_setfield(L,-2,"__index");
  lua_settop(L,-2);
  createstdfile(L,_stdin,"_IO_input","stdin");
  createstdfile(L,_stdout,"_IO_output","stdout");
  createstdfile(L,_stderr,(char *)0x0,"stderr");
  return 1;
}

Assistant:

LUAMOD_API int luaopen_io (lua_State *L) {
  luaL_newlib(L, iolib);  /* new module */
  createmeta(L);
  /* create (and set) default files */
  createstdfile(L, stdin, IO_INPUT, "stdin");
  createstdfile(L, stdout, IO_OUTPUT, "stdout");
  createstdfile(L, stderr, NULL, "stderr");
  return 1;
}